

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall
IR::ByteCodeUsesInstr::Aggregate(ByteCodeUsesInstr *this,ByteCodeUsesInstr *byteCodeUsesInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->super_Instr).m_func != (byteCodeUsesInstr->super_Instr).m_func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x3ee,"(this->m_func == byteCodeUsesInstr->m_func)",
                       "this->m_func == byteCodeUsesInstr->m_func");
    if (!bVar2) goto LAB_004b4988;
    *puVar3 = 0;
  }
  if (byteCodeUsesInstr->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if ((byteCodeUsesInstr->super_Instr).m_dst != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x3f1,"(byteCodeUsesInstr->GetDst() == nullptr)",
                         "byteCodeUsesInstr->GetDst() == nullptr");
      if (!bVar2) {
LAB_004b4988:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (this->byteCodeUpwardExposedUsed == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      this->byteCodeUpwardExposedUsed = byteCodeUsesInstr->byteCodeUpwardExposedUsed;
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->byteCodeUpwardExposedUsed,byteCodeUsesInstr->byteCodeUpwardExposedUsed);
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (byteCodeUsesInstr->byteCodeUpwardExposedUsed->alloc,
                 byteCodeUsesInstr->byteCodeUpwardExposedUsed);
    }
    byteCodeUsesInstr->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  return;
}

Assistant:

void ByteCodeUsesInstr::Aggregate(ByteCodeUsesInstr * byteCodeUsesInstr)
{
    Assert(this->m_func == byteCodeUsesInstr->m_func);
    if (byteCodeUsesInstr->byteCodeUpwardExposedUsed)
    {
        Assert(byteCodeUsesInstr->GetDst() == nullptr);
        if (this->byteCodeUpwardExposedUsed)
        {
            this->byteCodeUpwardExposedUsed->Or(byteCodeUsesInstr->byteCodeUpwardExposedUsed);
            JitAdelete(byteCodeUsesInstr->byteCodeUpwardExposedUsed->GetAllocator(), byteCodeUsesInstr->byteCodeUpwardExposedUsed);
            byteCodeUsesInstr->byteCodeUpwardExposedUsed = nullptr;
        }
        else
        {
            this->byteCodeUpwardExposedUsed = byteCodeUsesInstr->byteCodeUpwardExposedUsed;
            byteCodeUsesInstr->byteCodeUpwardExposedUsed = nullptr;
        }
    }
}